

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::Gemm_x86_avx::Gemm_x86_avx(Gemm_x86_avx *this)

{
  Gemm *in_RDI;
  
  Gemm::Gemm(in_RDI);
  (in_RDI->super_Layer)._vptr_Layer = (_func_int **)&PTR__Gemm_x86_avx_0201cd28;
  in_RDI[1].super_Layer._vptr_Layer = (_func_int **)0x0;
  in_RDI[1].super_Layer.one_blob_only = false;
  in_RDI[1].super_Layer.support_inplace = false;
  in_RDI[1].super_Layer.support_vulkan = false;
  in_RDI[1].super_Layer.support_packing = false;
  in_RDI[1].super_Layer.support_bf16_storage = false;
  in_RDI[1].super_Layer.support_fp16_storage = false;
  in_RDI[1].super_Layer.support_int8_storage = false;
  in_RDI[1].super_Layer.support_image_storage = false;
  in_RDI[1].super_Layer.support_tensor_storage = false;
  in_RDI[1].super_Layer.support_reserved_00 = false;
  in_RDI[1].super_Layer.support_reserved_0 = false;
  in_RDI[1].super_Layer.support_reserved_1 = false;
  in_RDI[1].super_Layer.support_reserved_2 = false;
  in_RDI[1].super_Layer.support_reserved_3 = false;
  in_RDI[1].super_Layer.support_reserved_4 = false;
  in_RDI[1].super_Layer.support_reserved_5 = false;
  in_RDI[1].super_Layer.support_reserved_6 = false;
  in_RDI[1].super_Layer.support_reserved_7 = false;
  in_RDI[1].super_Layer.support_reserved_8 = false;
  in_RDI[1].super_Layer.support_reserved_9 = false;
  in_RDI[1].super_Layer.userdata = (void *)0x0;
  in_RDI[1].super_Layer.typeindex = 0;
  *(undefined4 *)&in_RDI[1].super_Layer.field_0x2c = 0;
  *(undefined4 *)&in_RDI[1].super_Layer.type = 0;
  *(undefined4 *)&in_RDI[1].super_Layer.type.field_0x4 = 0;
  *(undefined4 *)&in_RDI[1].super_Layer.type._M_string_length = 0;
  in_RDI[1].super_Layer.type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[1].super_Layer.type.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[1].super_Layer.name = 0;
  in_RDI[1].super_Layer.name._M_string_length = 0;
  *(undefined4 *)&in_RDI[1].super_Layer.name.field_2 = 0;
  *(undefined8 *)((long)&in_RDI[1].super_Layer.name.field_2 + 8) = 0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_Layer.bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_Layer.bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  in_RDI[1].super_Layer.tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[1].super_Layer.tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[1].super_Layer.tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].super_Layer.bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  in_RDI[1].super_Layer.bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_Layer.top_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_Layer.top_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_finish + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].super_Layer.top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  in_RDI[1].alpha = 0.0;
  in_RDI[1].beta = 0.0;
  (in_RDI->super_Layer).support_packing = true;
  *(undefined4 *)&in_RDI->field_0x244 = 0;
  return;
}

Assistant:

Gemm_x86_avx::Gemm_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    nT = 0;
}